

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::
SubscriptionTest_TestMergingPriceMapWithFewerBidLevelsClearsExcessLevels_Test::TestBody
          (SubscriptionTest_TestMergingPriceMapWithFewerBidLevelsClearsExcessLevels_Test *this)

{
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  mapped_type *pmVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  *__x;
  char *pcVar4;
  allocator<char> local_3d9;
  AssertionResult gtest_ar_2;
  key_type local_3c8;
  AssertionResult gtest_ar;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_388;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  result;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  new_price_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  price_map;
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  
  price_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &price_map._M_t._M_impl.super__Rb_tree_header._M_header;
  price_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  price_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  price_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  price_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       price_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidLevels",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskLevels",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::string<std::allocator<char>>(local_30,"Firm1",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidFirm1",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"Firm2",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidFirm2",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"Firm3",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidFirm3",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"Firm4",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidFirm4",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"Firm5",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidFirm5",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"Firm1",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskFirm1",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"Firm2",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskFirm2",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,"Firm3",(allocator<char> *)&local_3c8);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskFirm3",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"Firm4",(allocator<char> *)&local_3c8);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskFirm4",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,"Firm5",(allocator<char> *)&local_3c8);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_150);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskFirm5",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_150);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidSize1",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidSize2",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidSize3",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidSize4",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidSize5",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskSize1",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskSize2",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskSize3",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskSize4",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskSize5",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.2304);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"Bid1",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.2303);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"Bid2",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.2302);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"Bid3",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.2301);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"Bid4",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.23);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"Bid5",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.2305);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"Ask1",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.2306);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"Ask2",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.2307);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"Ask3",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.2308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"Ask4",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.2309);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"Ask5",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0x9c4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidTime1",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0x9c5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidTime2",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0x9c6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidTime3",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0x9c7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidTime4",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0x9c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidTime5",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0x5dc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskTime1",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0x5dd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskTime2",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0x5de);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskTime3",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0x5df);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskTime4",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0x5e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskTime5",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"ID-1",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidID1",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"ID-2",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidID2",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"ID-3",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidID3",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"ID-4",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidID4",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"ID-5",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidID5",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"ID-1",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskID1",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"ID-2",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_230);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskID2",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"ID-3",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskID3",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"ID-4",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskID4",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"ID-5",(allocator<char> *)&local_3c8)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskID5",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  std::__cxx11::string::~string(local_290);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.0001);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidSpot1",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.0002);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidSpot2",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.0003);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidSpot3",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.0004);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidSpot4",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.0005);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidSpot5",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.0006);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskSpot1",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.0007);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskSpot2",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.0008);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskSpot3",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.0009);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskSpot4",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,1.001);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskSpot5",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0.0012);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidForwardPoints1",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0.0022);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidForwardPoints2",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0.0032);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidForwardPoints3",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0.0042);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidForwardPoints4",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0.0052);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"BidForwardPoints5",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0.0001);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskForwardPoints1",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0.0002);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskForwardPoints2",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0.0003);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskForwardPoints3",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0.0004);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskForwardPoints4",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&result,0.0005);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_price_map,"AskForwardPoints5",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&price_map,(key_type *)&new_price_map);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&result);
  std::__cxx11::string::~string((string *)&new_price_map);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&result);
  bidfx_public_api::price::Subscription::MergePriceMap
            ((map *)(this->super_SubscriptionTest).subscription_,SUB81(&price_map,0));
  new_price_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &new_price_map._M_t._M_impl.super__Rb_tree_header._M_header;
  new_price_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  new_price_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  new_price_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  new_price_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       new_price_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&local_3c8,2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"BidLevels",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&new_price_map,(key_type *)&result);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&local_3c8);
  std::__cxx11::string::~string((string *)&result);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&local_3c8);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&local_3c8,3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"AskLevels",(allocator<char> *)&gtest_ar);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&new_price_map,(key_type *)&result);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&local_3c8);
  std::__cxx11::string::~string((string *)&result);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&local_3c8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b0,"NewFirm2",(allocator<char> *)&gtest_ar);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&local_3c8,local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"BidFirm2",(allocator<char> *)&gtest_ar_2);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&new_price_map,(key_type *)&result);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&local_3c8);
  std::__cxx11::string::~string((string *)&result);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&local_3c8);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d0,"NewFirm1",(allocator<char> *)&gtest_ar);
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&local_3c8,local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"AskFirm1",(allocator<char> *)&gtest_ar_2);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&new_price_map,(key_type *)&result);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&local_3c8);
  std::__cxx11::string::~string((string *)&result);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&local_3c8);
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"Firm1",(allocator<char> *)&gtest_ar)
  ;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&local_3c8,local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"AskFirm2",(allocator<char> *)&gtest_ar_2);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[](&new_price_map,(key_type *)&result);
  bidfx_public_api::price::PriceField::operator=(pmVar3,(PriceField *)&local_3c8);
  std::__cxx11::string::~string((string *)&result);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&local_3c8);
  std::__cxx11::string::~string(local_2f0);
  bidfx_public_api::price::Subscription::MergePriceMap
            ((map *)(this->super_SubscriptionTest).subscription_,SUB81(&new_price_map,0));
  __x = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
         *)bidfx_public_api::price::Subscription::GetAllPriceFields_abi_cxx11_();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::_Rb_tree(&result._M_t,__x);
  gtest_ar_2._0_4_ = 3;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskLevels",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node._0_4_ = bidfx_public_api::price::PriceField::GetInt();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"3","result[\"AskLevels\"].GetInt()",(int *)&gtest_ar_2,
             (int *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x79,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_4_ = 2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidLevels",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  uVar2 = bidfx_public_api::price::PriceField::GetInt();
  local_388._M_node._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"2","result[\"BidLevels\"].GetInt()",(int *)&gtest_ar_2,
             (int *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x7a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"AskFirm1",(allocator<char> *)&local_388);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,(key_type *)&gtest_ar);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"NewFirm1\"","result[\"AskFirm1\"].GetString()",
             (char (*) [9])"NewFirm1",&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x7b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"AskFirm2",(allocator<char> *)&local_388);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,(key_type *)&gtest_ar);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"Firm1\"","result[\"AskFirm2\"].GetString()",
             (char (*) [6])0x2175f0,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x7c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"AskFirm3",(allocator<char> *)&local_388);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,(key_type *)&gtest_ar);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"Firm3\"","result[\"AskFirm3\"].GetString()",
             (char (*) [6])0x217602,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x7d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  p_Var1 = &result._M_t._M_impl.super__Rb_tree_header;
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskFirm4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"AskFirm4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x7e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskFirm5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"AskFirm5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x7f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"BidFirm1",(allocator<char> *)&local_388);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,(key_type *)&gtest_ar);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"Firm1\"","result[\"BidFirm1\"].GetString()",
             (char (*) [6])0x2175f0,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x80,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"BidFirm2",(allocator<char> *)&local_388);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,(key_type *)&gtest_ar);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"NewFirm2\"","result[\"BidFirm2\"].GetString()",
             (char (*) [9])"NewFirm2",&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x81,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidFirm3",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidFirm3\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x82,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidFirm4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidFirm4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x83,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidFirm5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidFirm5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x84,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_388._M_node._0_4_ = 1000;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidSize1",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  gtest_ar_2._0_8_ = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"1000","result[\"BidSize1\"].GetLong()",(int *)&local_388,
             (long *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x85,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_388._M_node._0_4_ = 1000;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidSize2",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  gtest_ar_2._0_8_ = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"1000","result[\"BidSize2\"].GetLong()",(int *)&local_388,
             (long *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x86,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidSize3",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidSize3\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x87,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidSize4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidSize4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x88,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidSize5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidSize5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x89,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_388._M_node._0_4_ = 1000;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskSize1",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  gtest_ar_2._0_8_ = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"1000","result[\"AskSize1\"].GetLong()",(int *)&local_388,
             (long *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x8a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_388._M_node._0_4_ = 1000;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskSize2",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  gtest_ar_2._0_8_ = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"1000","result[\"AskSize2\"].GetLong()",(int *)&local_388,
             (long *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x8b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_388._M_node._0_4_ = 1000;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskSize3",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  gtest_ar_2._0_8_ = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"1000","result[\"AskSize3\"].GetLong()",(int *)&local_388,
             (long *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x8c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskSize4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"AskSize4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskSize5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"AskSize5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x8e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3ff3afb7e90ff9;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Bid1",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.2304","result[\"Bid1\"].GetDouble()",(double *)&gtest_ar_2,
             (double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x8f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3ff3af4f0d844d;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Bid2",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.2303","result[\"Bid2\"].GetDouble()",(double *)&gtest_ar_2,
             (double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x90,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Bid3",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"Bid3\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x91,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Bid4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"Bid4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x92,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Bid5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"Bid5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x93,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3ff3b020c49ba5;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Ask1",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.2305","result[\"Ask1\"].GetDouble()",(double *)&gtest_ar_2,
             (double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x94,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3ff3b089a02752;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Ask2",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.2306","result[\"Ask2\"].GetDouble()",(double *)&gtest_ar_2,
             (double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x95,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3ff3b0f27bb2fe;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Ask3",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.2307","result[\"Ask3\"].GetDouble()",(double *)&gtest_ar_2,
             (double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x96,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Ask4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"Ask4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x97,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Ask5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"Ask5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x98,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_388._M_node._0_4_ = 0x9c4;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidTime1",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  gtest_ar_2._0_8_ = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"2500","result[\"BidTime1\"].GetLong()",(int *)&local_388,
             (long *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x99,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_388._M_node._0_4_ = 0x9c5;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidTime2",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  gtest_ar_2._0_8_ = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"2501","result[\"BidTime2\"].GetLong()",(int *)&local_388,
             (long *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x9a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidTime3",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidTime3\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x9b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidTime4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidTime4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x9c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidTime5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidTime5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x9d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_388._M_node._0_4_ = 0x5dc;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskTime1",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  gtest_ar_2._0_8_ = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"1500","result[\"AskTime1\"].GetLong()",(int *)&local_388,
             (long *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x9e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_388._M_node._0_4_ = 0x5dd;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskTime2",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  gtest_ar_2._0_8_ = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"1501","result[\"AskTime2\"].GetLong()",(int *)&local_388,
             (long *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x9f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_388._M_node._0_4_ = 0x5de;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskTime3",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  gtest_ar_2._0_8_ = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"1502","result[\"AskTime3\"].GetLong()",(int *)&local_388,
             (long *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskTime4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"AskTime4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskTime5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"AskTime5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"BidID1",(allocator<char> *)&local_388);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,(key_type *)&gtest_ar);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"ID-1\"","result[\"BidID1\"].GetString()",
             (char (*) [5])"ID-1",&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"BidID2",(allocator<char> *)&local_388);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,(key_type *)&gtest_ar);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"ID-2\"","result[\"BidID2\"].GetString()",
             (char (*) [5])"ID-2",&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidID3",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidID3\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidID4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidID4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidID5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidID5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"AskID1",(allocator<char> *)&local_388);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,(key_type *)&gtest_ar);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"ID-1\"","result[\"AskID1\"].GetString()",
             (char (*) [5])"ID-1",&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"AskID2",(allocator<char> *)&local_388);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,(key_type *)&gtest_ar);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"ID-2\"","result[\"AskID2\"].GetString()",
             (char (*) [5])"ID-2",&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"AskID3",(allocator<char> *)&local_388);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,(key_type *)&gtest_ar);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"ID-3\"","result[\"AskID3\"].GetString()",
             (char (*) [5])"ID-3",&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xaa,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskID4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"AskID4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xab,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskID5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"AskID5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xac,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3ff00068db8bac;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidSpot1",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0001","result[\"BidSpot1\"].GetDouble()",(double *)&gtest_ar_2
             ,(double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xad,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3ff000d1b71758;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidSpot2",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0002","result[\"BidSpot2\"].GetDouble()",(double *)&gtest_ar_2
             ,(double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xae,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidSpot3",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidSpot3\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xaf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidSpot4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidSpot4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"BidSpot5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidSpot5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3ff0027525460a;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskSpot1",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0006","result[\"AskSpot1\"].GetDouble()",(double *)&gtest_ar_2
             ,(double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3ff002de00d1b7;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskSpot2",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0007","result[\"AskSpot2\"].GetDouble()",(double *)&gtest_ar_2
             ,(double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3ff00346dc5d63;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskSpot3",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0008","result[\"AskSpot3\"].GetDouble()",(double *)&gtest_ar_2
             ,(double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskSpot4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"AskSpot4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"AskSpot5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"AskSpot5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3f53a92a305532;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"BidForwardPoints1",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0012","result[\"BidForwardPoints1\"].GetDouble()",
             (double *)&gtest_ar_2,(double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3f6205bc01a36e;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"BidForwardPoints2",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0022","result[\"BidForwardPoints2\"].GetDouble()",
             (double *)&gtest_ar_2,(double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"BidForwardPoints3",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidForwardPoints3\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"BidForwardPoints4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidForwardPoints4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xba,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"BidForwardPoints5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"BidForwardPoints5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xbb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3f1a36e2eb1c43;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"AskForwardPoints1",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0001","result[\"AskForwardPoints1\"].GetDouble()",
             (double *)&gtest_ar_2,(double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xbc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3f2a36e2eb1c43;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"AskForwardPoints2",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0002","result[\"AskForwardPoints2\"].GetDouble()",
             (double *)&gtest_ar_2,(double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xbd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3f33a92a305532;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"AskForwardPoints3",&local_3d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[](&result,&local_3c8);
  local_388._M_node = (_Base_ptr)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0003","result[\"AskForwardPoints3\"].GetDouble()",
             (double *)&gtest_ar_2,(double *)&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xbe,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"AskForwardPoints4",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"AskForwardPoints4\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xbf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"AskForwardPoints5",&local_3d9);
  local_388._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find(&result._M_t,&local_3c8);
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((internal *)&gtest_ar,"result.end()","result.find(\"AskForwardPoints5\")",
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
              *)&gtest_ar_2,&local_388);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xc0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::~_Rb_tree(&result._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::~_Rb_tree(&new_price_map._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::~_Rb_tree(&price_map._M_t);
  return;
}

Assistant:

TEST_F(SubscriptionTest, TestMergingPriceMapWithFewerBidLevelsClearsExcessLevels)
{
    std::map<std::string, PriceField> price_map;
    price_map["BidLevels"] = PriceField(5);
    price_map["AskLevels"] = PriceField(5);
    price_map["BidFirm1"] = PriceField("Firm1");
    price_map["BidFirm2"] = PriceField("Firm2");
    price_map["BidFirm3"] = PriceField("Firm3");
    price_map["BidFirm4"] = PriceField("Firm4");
    price_map["BidFirm5"] = PriceField("Firm5");
    price_map["AskFirm1"] = PriceField("Firm1");
    price_map["AskFirm2"] = PriceField("Firm2");
    price_map["AskFirm3"] = PriceField("Firm3");
    price_map["AskFirm4"] = PriceField("Firm4");
    price_map["AskFirm5"] = PriceField("Firm5");
    price_map["BidSize1"] = PriceField(static_cast<int64_t>(1000L));
    price_map["BidSize2"] = PriceField(static_cast<int64_t>(1000L));
    price_map["BidSize3"] = PriceField(static_cast<int64_t>(1000L));
    price_map["BidSize4"] = PriceField(static_cast<int64_t>(1000L));
    price_map["BidSize5"] = PriceField(static_cast<int64_t>(1000L));
    price_map["AskSize1"] = PriceField(static_cast<int64_t>(1000L));
    price_map["AskSize2"] = PriceField(static_cast<int64_t>(1000L));
    price_map["AskSize3"] = PriceField(static_cast<int64_t>(1000L));
    price_map["AskSize4"] = PriceField(static_cast<int64_t>(1000L));
    price_map["AskSize5"] = PriceField(static_cast<int64_t>(1000L));
    price_map["Bid1"] = PriceField(1.2304);
    price_map["Bid2"] = PriceField(1.2303);
    price_map["Bid3"] = PriceField(1.2302);
    price_map["Bid4"] = PriceField(1.2301);
    price_map["Bid5"] = PriceField(1.2300);
    price_map["Ask1"] = PriceField(1.2305);
    price_map["Ask2"] = PriceField(1.2306);
    price_map["Ask3"] = PriceField(1.2307);
    price_map["Ask4"] = PriceField(1.2308);
    price_map["Ask5"] = PriceField(1.2309);
    price_map["BidTime1"] = PriceField(static_cast<int64_t>(2500L));
    price_map["BidTime2"] = PriceField(static_cast<int64_t>(2501L));
    price_map["BidTime3"] = PriceField(static_cast<int64_t>(2502L));
    price_map["BidTime4"] = PriceField(static_cast<int64_t>(2503L));
    price_map["BidTime5"] = PriceField(static_cast<int64_t>(2504L));
    price_map["AskTime1"] = PriceField(static_cast<int64_t>(1500L));
    price_map["AskTime2"] = PriceField(static_cast<int64_t>(1501L));
    price_map["AskTime3"] = PriceField(static_cast<int64_t>(1502L));
    price_map["AskTime4"] = PriceField(static_cast<int64_t>(1503L));
    price_map["AskTime5"] = PriceField(static_cast<int64_t>(1504L));
    price_map["BidID1"] = PriceField("ID-1");
    price_map["BidID2"] = PriceField("ID-2");
    price_map["BidID3"] = PriceField("ID-3");
    price_map["BidID4"] = PriceField("ID-4");
    price_map["BidID5"] = PriceField("ID-5");
    price_map["AskID1"] = PriceField("ID-1");
    price_map["AskID2"] = PriceField("ID-2");
    price_map["AskID3"] = PriceField("ID-3");
    price_map["AskID4"] = PriceField("ID-4");
    price_map["AskID5"] = PriceField("ID-5");
    price_map["BidSpot1"] = PriceField(1.0001);
    price_map["BidSpot2"] = PriceField(1.0002);
    price_map["BidSpot3"] = PriceField(1.0003);
    price_map["BidSpot4"] = PriceField(1.0004);
    price_map["BidSpot5"] = PriceField(1.0005);
    price_map["AskSpot1"] = PriceField(1.0006);
    price_map["AskSpot2"] = PriceField(1.0007);
    price_map["AskSpot3"] = PriceField(1.0008);
    price_map["AskSpot4"] = PriceField(1.0009);
    price_map["AskSpot5"] = PriceField(1.0010);
    price_map["BidForwardPoints1"] = PriceField(0.0012);
    price_map["BidForwardPoints2"] = PriceField(0.0022);
    price_map["BidForwardPoints3"] = PriceField(0.0032);
    price_map["BidForwardPoints4"] = PriceField(0.0042);
    price_map["BidForwardPoints5"] = PriceField(0.0052);
    price_map["AskForwardPoints1"] = PriceField(0.0001);
    price_map["AskForwardPoints2"] = PriceField(0.0002);
    price_map["AskForwardPoints3"] = PriceField(0.0003);
    price_map["AskForwardPoints4"] = PriceField(0.0004);
    price_map["AskForwardPoints5"] = PriceField(0.0005);
    subscription_->MergePriceMap(price_map, false);

    std::map<std::string, PriceField> new_price_map;
    new_price_map["BidLevels"] = PriceField(2);
    new_price_map["AskLevels"] = PriceField(3);
    new_price_map["BidFirm2"] = PriceField("NewFirm2");
    new_price_map["AskFirm1"] = PriceField("NewFirm1");
    new_price_map["AskFirm2"] = PriceField("Firm1");

    subscription_->MergePriceMap(new_price_map, false);

    std::map<std::string, PriceField> result = subscription_->GetAllPriceFields();
    EXPECT_EQ(3, result["AskLevels"].GetInt());
    EXPECT_EQ(2, result["BidLevels"].GetInt());
    EXPECT_EQ("NewFirm1", result["AskFirm1"].GetString());
    EXPECT_EQ("Firm1", result["AskFirm2"].GetString());
    EXPECT_EQ("Firm3", result["AskFirm3"].GetString());
    EXPECT_EQ(result.end(), result.find("AskFirm4"));
    EXPECT_EQ(result.end(), result.find("AskFirm5"));
    EXPECT_EQ("Firm1", result["BidFirm1"].GetString());
    EXPECT_EQ("NewFirm2", result["BidFirm2"].GetString());
    EXPECT_EQ(result.end(), result.find("BidFirm3"));
    EXPECT_EQ(result.end(), result.find("BidFirm4"));
    EXPECT_EQ(result.end(), result.find("BidFirm5"));
    EXPECT_EQ(1000, result["BidSize1"].GetLong());
    EXPECT_EQ(1000, result["BidSize2"].GetLong());
    EXPECT_EQ(result.end(), result.find("BidSize3"));
    EXPECT_EQ(result.end(), result.find("BidSize4"));
    EXPECT_EQ(result.end(), result.find("BidSize5"));
    EXPECT_EQ(1000, result["AskSize1"].GetLong());
    EXPECT_EQ(1000, result["AskSize2"].GetLong());
    EXPECT_EQ(1000, result["AskSize3"].GetLong());
    EXPECT_EQ(result.end(), result.find("AskSize4"));
    EXPECT_EQ(result.end(), result.find("AskSize5"));
    EXPECT_EQ(1.2304, result["Bid1"].GetDouble());
    EXPECT_EQ(1.2303, result["Bid2"].GetDouble());
    EXPECT_EQ(result.end(), result.find("Bid3"));
    EXPECT_EQ(result.end(), result.find("Bid4"));
    EXPECT_EQ(result.end(), result.find("Bid5"));
    EXPECT_EQ(1.2305, result["Ask1"].GetDouble());
    EXPECT_EQ(1.2306, result["Ask2"].GetDouble());
    EXPECT_EQ(1.2307, result["Ask3"].GetDouble());
    EXPECT_EQ(result.end(), result.find("Ask4"));
    EXPECT_EQ(result.end(), result.find("Ask5"));
    EXPECT_EQ(2500, result["BidTime1"].GetLong());
    EXPECT_EQ(2501, result["BidTime2"].GetLong());
    EXPECT_EQ(result.end(), result.find("BidTime3"));
    EXPECT_EQ(result.end(), result.find("BidTime4"));
    EXPECT_EQ(result.end(), result.find("BidTime5"));
    EXPECT_EQ(1500, result["AskTime1"].GetLong());
    EXPECT_EQ(1501, result["AskTime2"].GetLong());
    EXPECT_EQ(1502, result["AskTime3"].GetLong());
    EXPECT_EQ(result.end(), result.find("AskTime4"));
    EXPECT_EQ(result.end(), result.find("AskTime5"));
    EXPECT_EQ("ID-1", result["BidID1"].GetString());
    EXPECT_EQ("ID-2", result["BidID2"].GetString());
    EXPECT_EQ(result.end(), result.find("BidID3"));
    EXPECT_EQ(result.end(), result.find("BidID4"));
    EXPECT_EQ(result.end(), result.find("BidID5"));
    EXPECT_EQ("ID-1", result["AskID1"].GetString());
    EXPECT_EQ("ID-2", result["AskID2"].GetString());
    EXPECT_EQ("ID-3", result["AskID3"].GetString());
    EXPECT_EQ(result.end(), result.find("AskID4"));
    EXPECT_EQ(result.end(), result.find("AskID5"));
    EXPECT_EQ(1.0001, result["BidSpot1"].GetDouble());
    EXPECT_EQ(1.0002, result["BidSpot2"].GetDouble());
    EXPECT_EQ(result.end(), result.find("BidSpot3"));
    EXPECT_EQ(result.end(), result.find("BidSpot4"));
    EXPECT_EQ(result.end(), result.find("BidSpot5"));
    EXPECT_EQ(1.0006, result["AskSpot1"].GetDouble());
    EXPECT_EQ(1.0007, result["AskSpot2"].GetDouble());
    EXPECT_EQ(1.0008, result["AskSpot3"].GetDouble());
    EXPECT_EQ(result.end(), result.find("AskSpot4"));
    EXPECT_EQ(result.end(), result.find("AskSpot5"));
    EXPECT_EQ(0.0012, result["BidForwardPoints1"].GetDouble());
    EXPECT_EQ(0.0022, result["BidForwardPoints2"].GetDouble());
    EXPECT_EQ(result.end(), result.find("BidForwardPoints3"));
    EXPECT_EQ(result.end(), result.find("BidForwardPoints4"));
    EXPECT_EQ(result.end(), result.find("BidForwardPoints5"));
    EXPECT_EQ(0.0001, result["AskForwardPoints1"].GetDouble());
    EXPECT_EQ(0.0002, result["AskForwardPoints2"].GetDouble());
    EXPECT_EQ(0.0003, result["AskForwardPoints3"].GetDouble());
    EXPECT_EQ(result.end(), result.find("AskForwardPoints4"));
    EXPECT_EQ(result.end(), result.find("AskForwardPoints5"));
}